

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

void Vec_IntTwoMerge2(Vec_Int_t *vArr1,Vec_Int_t *vArr2,Vec_Int_t *vArr)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  ulong uVar6;
  int *piVar7;
  int *piVar8;
  
  Vec_IntGrow(vArr,vArr2->nSize + vArr1->nSize);
  piVar4 = vArr->pArray;
  piVar8 = vArr1->pArray;
  piVar7 = vArr2->pArray;
  piVar1 = piVar8 + vArr1->nSize;
  piVar2 = piVar7 + vArr2->nSize;
  uVar6 = 0;
  while ((piVar8 < piVar1 && (piVar7 < piVar2))) {
    iVar5 = *piVar8;
    iVar3 = *piVar7;
    if (iVar5 == iVar3) {
      piVar8 = piVar8 + 1;
      *(int *)((long)piVar4 + uVar6) = iVar5;
      piVar7 = piVar7 + 1;
    }
    else if (iVar5 < iVar3) {
      piVar8 = piVar8 + 1;
      *(int *)((long)piVar4 + uVar6) = iVar5;
    }
    else {
      piVar7 = piVar7 + 1;
      *(int *)((long)piVar4 + uVar6) = iVar3;
    }
    uVar6 = uVar6 + 4;
  }
  for (; piVar8 < piVar1; piVar8 = piVar8 + 1) {
    *(int *)((long)piVar4 + uVar6) = *piVar8;
    uVar6 = uVar6 + 4;
  }
  for (; piVar7 < piVar2; piVar7 = piVar7 + 1) {
    *(int *)((long)piVar4 + uVar6) = *piVar7;
    uVar6 = uVar6 + 4;
  }
  iVar5 = (int)(uVar6 >> 2);
  vArr->nSize = iVar5;
  if (vArr->nCap < iVar5) {
    __assert_fail("vArr->nSize <= vArr->nCap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x722,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (iVar5 < vArr1->nSize) {
    __assert_fail("vArr->nSize >= vArr1->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x723,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (iVar5 < vArr2->nSize) {
    __assert_fail("vArr->nSize >= vArr2->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x724,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  return;
}

Assistant:

static inline void Vec_IntTwoMerge2( Vec_Int_t * vArr1, Vec_Int_t * vArr2, Vec_Int_t * vArr )
{
    Vec_IntGrow( vArr, Vec_IntSize(vArr1) + Vec_IntSize(vArr2) );
    Vec_IntTwoMerge2Int( vArr1, vArr2, vArr );
}